

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

void __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::Finished(FlatBufferBuilderImpl<false> *this)

{
  FlatBufferBuilderImpl<false> *this_local;
  
  if ((this->finished & 1U) != 0) {
    return;
  }
  __assert_fail("finished",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                ,0x10b,
                "void flatbuffers::FlatBufferBuilderImpl<>::Finished() const [Is64Aware = false]");
}

Assistant:

void Finished() const {
    // If you get this assert, you're attempting to get access a buffer
    // which hasn't been finished yet. Be sure to call
    // FlatBufferBuilder::Finish with your root table.
    // If you really need to access an unfinished buffer, call
    // GetCurrentBufferPointer instead.
    FLATBUFFERS_ASSERT(finished);
  }